

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResetAllSchemasOfConnection(sqlite3 *db)

{
  Schema *pSVar1;
  Db *pDb;
  int i;
  sqlite3 *db_local;
  
  sqlite3BtreeEnterAll(db);
  for (pDb._4_4_ = 0; pDb._4_4_ < db->nDb; pDb._4_4_ = pDb._4_4_ + 1) {
    if (db->aDb[pDb._4_4_].pSchema != (Schema *)0x0) {
      if (db->nSchemaLock == 0) {
        sqlite3SchemaClear(db->aDb[pDb._4_4_].pSchema);
      }
      else {
        pSVar1 = db->aDb[pDb._4_4_].pSchema;
        pSVar1->schemaFlags = pSVar1->schemaFlags | 8;
      }
    }
  }
  db->mDbFlags = db->mDbFlags & 0xffffffee;
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  if (db->nSchemaLock == 0) {
    sqlite3CollapseDatabaseArray(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetAllSchemasOfConnection(sqlite3 *db){
  int i;
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pSchema ){
      if( db->nSchemaLock==0 ){
        sqlite3SchemaClear(pDb->pSchema);
      }else{
        DbSetProperty(db, i, DB_ResetWanted);
      }
    }
  }
  db->mDbFlags &= ~(DBFLAG_SchemaChange|DBFLAG_SchemaKnownOk);
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  if( db->nSchemaLock==0 ){
    sqlite3CollapseDatabaseArray(db);
  }
}